

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

bool Assimp::Ogre::OgreBinarySerializer::ImportSkeleton(IOSystem *pIOHandler,Mesh *mesh)

{
  bool bVar1;
  Skeleton *this;
  MemoryStreamReaderPtr reader;
  OgreBinarySerializer serializer;
  undefined1 local_58 [16];
  string local_48;
  
  if ((mesh != (Mesh *)0x0) && ((mesh->skeletonRef)._M_string_length != 0)) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".skeleton.xml","");
    bVar1 = EndsWith(&mesh->skeletonRef,&local_48,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT44(local_48.field_2._M_allocated_capacity._4_4_,
                               local_48.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (!bVar1) {
      OpenReader((OgreBinarySerializer *)local_58,pIOHandler,&mesh->skeletonRef);
      bVar1 = local_58._0_8_ != 0;
      if (bVar1) {
        this = (Skeleton *)operator_new(0x38);
        Skeleton::Skeleton(this);
        local_48._M_dataplus._M_p = local_48._M_dataplus._M_p & 0xffffffff00000000;
        local_48._M_string_length = local_58._0_8_;
        local_48.field_2._M_allocated_capacity._0_4_ = 1;
        ReadSkeleton((OgreBinarySerializer *)&local_48,this);
        mesh->skeleton = this;
      }
      if ((MemoryStreamReader *)local_58._8_8_ == (MemoryStreamReader *)0x0) {
        return bVar1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      return bVar1;
    }
    OgreXmlSerializer::ImportSkeleton(pIOHandler,mesh);
  }
  return false;
}

Assistant:

bool OgreBinarySerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, Mesh *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    // Highly unusual to see in read world cases but support
    // binary mesh referencing a XML skeleton file.
    if (EndsWith(mesh->skeletonRef, ".skeleton.xml", false))
    {
        OgreXmlSerializer::ImportSkeleton(pIOHandler, mesh);
        return false;
    }

    MemoryStreamReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader)
      return false;

    Skeleton *skeleton = new Skeleton();
    OgreBinarySerializer serializer(reader.get(), OgreBinarySerializer::AM_Skeleton);
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}